

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::HttpService::Response::sendError
          (Response *this,uint statusCode,StringPtr statusText,HttpHeaders *headers)

{
  undefined1 *puVar1;
  undefined4 in_register_00000034;
  Promise<void> promise;
  Own<kj::AsyncOutputStream,_std::nullptr_t> stream;
  undefined1 local_48 [16];
  undefined8 *local_38;
  undefined1 local_30;
  undefined1 *local_28;
  
  puVar1 = (undefined1 *)((long)&headers[-1].ownedStrings.builder.disposer + 7);
  local_30 = 1;
  local_28 = puVar1;
  (*(code *)**(undefined8 **)CONCAT44(in_register_00000034,statusCode))
            (local_48 + 8,(undefined8 *)CONCAT44(in_register_00000034,statusCode),
             statusText.content.ptr);
  (**(code **)*local_38)(local_48,local_38,statusText.content.size_,puVar1);
  Promise<void>::attach<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
            ((Promise<void> *)this,(Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_48);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_48);
  Own<kj::AsyncOutputStream,_std::nullptr_t>::dispose
            ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)(local_48 + 8));
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpService::Response::sendError(
    uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers) {
  auto stream = send(statusCode, statusText, headers, statusText.size());
  auto promise = stream->write(statusText.asBytes());
  return promise.attach(kj::mv(stream));
}